

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O2

void do_hobble(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  CHAR_DATA *victim;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  OBJ_DATA *pOVar8;
  ulong uVar9;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA af2;
  
  iVar4 = get_skill(ch,(int)gsn_hobble);
  if (iVar4 == 0) {
    txt = "Huh?\n\r";
LAB_003745cc:
    send_to_char(txt,ch);
    return;
  }
  victim = ch->fighting;
  if (victim == (CHAR_DATA *)0x0) {
    txt = "You must be in combat to do that!\n\r";
    goto LAB_003745cc;
  }
  if (victim->legs < 1) {
    txt = "You cannot strike what does not exist.\n\r";
    goto LAB_003745cc;
  }
  if (victim->legs == 1) {
    txt = "They are already hobbled.\n\r";
    goto LAB_003745cc;
  }
  if ((int)victim->size < ch->size + -1) {
    txt = "You cannot aim at such a small target.\n\r";
    goto LAB_003745cc;
  }
  iVar5 = number_percent();
  pOVar8 = get_eq_char(ch,0x10);
  if (pOVar8 == (OBJ_DATA *)0x0) {
    txt = "You cannot execute that move barehanded!\n\r";
    goto LAB_003745cc;
  }
  uVar6 = pOVar8->value[0] - 1;
  if ((8 < uVar6) || ((0x13fU >> (uVar6 & 0x1f) & 1) == 0)) {
    txt = "You cannot properly strike your opponent\'s legs with that.\n\r";
    goto LAB_003745cc;
  }
  uVar9 = (ulong)uVar6;
  iVar7 = *(int *)(&DAT_00415ea8 + uVar9 * 4);
  iVar1 = *(int *)(&DAT_00415ecc + uVar9 * 4);
  act(&DAT_00415e84 + *(int *)(&DAT_00415e84 + uVar9 * 4),ch,(void *)0x0,victim,3);
  act(&DAT_00415ea8 + iVar7,ch,(void *)0x0,victim,2);
  act(&DAT_00415ecc + iVar1,ch,(void *)0x0,victim,1);
  iVar7 = number_percent();
  if ((double)iVar4 * 0.75 <= (double)iVar7) {
    damage(ch,victim,0,(int)gsn_hobble,0,true);
    WAIT_STATE(ch,0x18);
    check_improve(ch,(int)gsn_hobble,false,1);
    return;
  }
  if ((double)iVar4 * 0.5 <= (double)iVar5) {
    one_hit_new(ch,victim,(int)gsn_hobble,true,false,0,0x50,(char *)0x0);
    bVar2 = is_affected(victim,(int)gsn_hobble);
    if (!bVar2) {
      init_affect(&af);
      af.where = 0;
      af.level = ch->level;
      af.duration = af.level / 8;
      af.type = gsn_hobble;
      af.location = 2;
      uVar6 = pOVar8->value[0] - 1;
      if ((uVar6 < 9) && ((0x13fU >> (uVar6 & 0x1f) & 1) != 0)) {
        af.modifier = af.level / *(short *)(&DAT_00415ef0 + (ulong)uVar6 * 2);
        af.location = 2;
      }
      af.aftype = 3;
      affect_to_char(victim,&af);
    }
    goto LAB_00374977;
  }
  init_affect(&af);
  af.where = 0;
  af.level = ch->level;
  af.duration = af.level / 8;
  af.type = gsn_hobble;
  af.aftype = 3;
  switch(pOVar8->value[0]) {
  case 1:
  case 5:
    act("$N\'s leg buckles beneath $m as your slash tears deep into muscle!",ch,(void *)0x0,victim,3
       );
    act("Your leg buckles beneath you as $n\'s slash tears deep into muscle.",ch,(void *)0x0,victim,
        2);
    act("$N\'s leg buckles beneath $m as $n\'s slash tears deep into muscle.",ch,(void *)0x0,victim,
        1);
    af.modifier = ch->level / -8;
    af.location = 2;
    af.aftype = 3;
    affect_join(victim,&af);
    init_affect(&af2);
    af2.where = 0;
    af2.level = ch->level;
    af2.duration = af2.level / 0xf;
    af2.type = gsn_bleeding;
    af2.location = 0;
    af2.modifier = 0;
    af2.aftype = 5;
    af2.tick_fun = bleeding_tick;
    af2.end_fun = (AFF_FUN *)0x0;
    af2.owner = ch;
    new_affect_to_char(victim,&af2);
    break;
  case 2:
    act("$N collapses to the ground in agony as you sever a tendon!",ch,(void *)0x0,victim,3);
    act("You collapse to the ground in agony as $n severs a tendon!",ch,(void *)0x0,victim,2);
    act("$N collapses to the ground in agony as $n severs a tendon!",ch,(void *)0x0,victim,1);
    af.modifier = ch->level / -5;
    af.location = 2;
    af.aftype = 3;
    affect_join(victim,&af);
    goto LAB_003748f7;
  case 3:
    act("$N falters, clutching $S leg in agony as your spear pierces $M clean through!",ch,
        (void *)0x0,victim,3);
    act("You falter, clutching your leg in agony as $n\'s spear pierces you clean through!",ch,
        (void *)0x0,victim,2);
    act("$N falters, clutching $S leg in agony as $n\'s spear pierces $M clean through!",ch,
        (void *)0x0,victim,1);
    af.modifier = ch->level / -7;
    af.location = 2;
    af.aftype = 3;
    affect_join(victim,&af);
    iVar4 = (int)victim->move - (int)(ch->level / 2);
    sVar3 = (short)iVar4;
    if (iVar4 < 1) {
      sVar3 = 0;
    }
    victim->move = sVar3;
LAB_003748f7:
    LAG_CHAR(victim,0x18);
    break;
  case 4:
  case 6:
  case 9:
    act("You hear the chilling sound of snapping bone as you land a solid blow.",ch,(void *)0x0,
        victim,3);
    act("You hear the chilling sound of snapping bone as $n lands a solid blow.",ch,(void *)0x0,
        victim,0);
    af.modifier = ch->level / -6;
    af.location = 2;
    af.aftype = 3;
    affect_join(victim,&af);
    sVar3 = victim->move / 2;
    if (sVar3 < 1) {
      sVar3 = 0;
    }
    victim->move = sVar3;
  }
  init_affect(&af);
  af.where = 0;
  af.level = ch->level;
  af.duration = af.level / 8;
  af.type = gsn_hobble;
  af.location = 0x21;
  af.modifier = -1;
  af.aftype = 5;
  affect_to_char(victim,&af);
  one_hit_new(ch,victim,(int)gsn_hobble,true,false,0,0x78,(char *)0x0);
LAB_00374977:
  WAIT_STATE(ch,0x18);
  check_improve(ch,(int)gsn_hobble,true,1);
  return;
}

Assistant:

void do_hobble(CHAR_DATA *ch, char *argument)
{
	int skill;
	CHAR_DATA *victim;
	OBJ_DATA *weapon;
	bool special = false;
	AFFECT_DATA af, af2;

	skill = get_skill(ch, gsn_hobble);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	victim = ch->fighting;

	if (victim == nullptr)
	{
		send_to_char("You must be in combat to do that!\n\r", ch);
		return;
	}

	if (victim->legs <= 0)
	{
		send_to_char("You cannot strike what does not exist.\n\r", ch);
		return;
	}
	else if (victim->legs <= 1)
	{
		send_to_char("They are already hobbled.\n\r", ch);
		return;
	}

	if (victim->size < ch->size - 1)
	{
		send_to_char("You cannot aim at such a small target.\n\r", ch);
		return;
	}

	if (number_percent() < .5 * skill)
		special = true;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon != nullptr)
	{
		switch (weapon->value[0])
		{
			case WEAPON_MACE:
				act("You lower your mace near the ground and sweep at $N's legs!", ch, 0, victim, TO_CHAR);
				act("$n lowers $s mace near the ground and sweeps at your legs!", ch, 0, victim, TO_VICT);
				act("$n lowers $s mace near the ground and sweeps at $N's legs!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_AXE:
				act("Pivoting suddenly, you bring your axe down in an arc towards $N's feet!", ch, 0, victim, TO_CHAR);
				act("Pivoting suddenly, $n brings $s axe down in an arc towards your feet!", ch, 0, victim, TO_VICT);
				act("Pivoting suddenly, $n brings $s axe down in an arc towards $N's feet!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_SWORD:
				act("You drop your blade under $N's guard and strike at $S legs!", ch, 0, victim, TO_CHAR);
				act("$n drops $s blade under your guard and strikes at your legs!", ch, 0, victim, TO_VICT);
				act("$n drops $s blade under $N's guard and strikes at $S legs!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_FLAIL:
				act("Lashing out with your flail, you aim a sweeping blow at $N's legs!", ch, 0, victim, TO_CHAR);
				act("Lashing out with $s flail, $n aims a sweeping blow at your legs!", ch, 0, victim, TO_VICT);
				act("Lashing out with $s flail, $n aims a sweeping blow at $N's legs!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_STAFF:
				act("Twirling your staff rapidly, you unleash a snapping strike at $N's feet!", ch, 0, victim, TO_CHAR);
				act("Twirling $s staff rapidly, $n unleashes a snapping strike at your feet!", ch, 0, victim, TO_VICT);
				act("Twirling $s staff rapidly, $n unleashes a snapping strike at $N's feet!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_SPEAR:
				act("Stabbing suddenly, you aim a precise strike at $N's calf!", ch, 0, victim, TO_CHAR);
				act("Stabbing suddenly, $n aims a precise strike at your calf!", ch, 0, victim, TO_VICT);
				act("Stabbing suddenly, $n aims a precise strike at $N's calf!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_DAGGER:
				act("You circle around $N and make a sweeping slash at $S calves!", ch, 0, victim, TO_CHAR);
				act("$n circles around you and makes a sweeping slash at your calves!", ch, 0, victim, TO_VICT);
				act("$n circles around $N and makes a sweeping slash at $S calves!", ch, 0, victim, TO_NOTVICT);
				break;
			default:
				send_to_char("You cannot properly strike your opponent's legs with that.\n\r", ch);
				return;
		}
	}
	else
	{
		send_to_char("You cannot execute that move barehanded!\n\r", ch);
		return;
	}

	if (number_percent() < .75 * skill)
	{
		if (special)
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = ch->level / 8;
			af.type = gsn_hobble;
			af.level = ch->level;
			af.aftype = AFT_MALADY;

			switch (weapon->value[0])
			{
				case WEAPON_MACE:
					act("You hear the chilling sound of snapping bone as you land a solid blow.", ch, 0, victim, TO_CHAR);
					act("You hear the chilling sound of snapping bone as $n lands a solid blow.", ch, 0, victim, TO_ROOM);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 6);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move / 2, 0);
					break;
				case WEAPON_AXE:
					act("$N's leg buckles beneath $m as your slash tears deep into muscle!", ch, 0, victim, TO_CHAR);
					act("Your leg buckles beneath you as $n's slash tears deep into muscle.", ch, 0, victim, TO_VICT);
					act("$N's leg buckles beneath $m as $n's slash tears deep into muscle.", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 8);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					init_affect(&af2);
					af2.where = TO_AFFECTS;
					af2.duration = ch->level / 15;
					af2.type = gsn_bleeding;
					af2.level = ch->level;
					af2.location = APPLY_NONE;
					af2.modifier = 0;
					af2.aftype = AFT_INVIS;
					af2.tick_fun = bleeding_tick;
					af2.end_fun = nullptr;
					af2.owner = ch;
					new_affect_to_char(victim, &af2);
					break;
				case WEAPON_SWORD:
					act("$N's leg buckles beneath $m as your slash tears deep into muscle!", ch, 0, victim, TO_CHAR);
					act("Your leg buckles beneath you as $n's slash tears deep into muscle.", ch, 0, victim, TO_VICT);
					act("$N's leg buckles beneath $m as $n's slash tears deep into muscle.", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 8);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					init_affect(&af2);
					af2.where = TO_AFFECTS;
					af2.duration = ch->level / 15;
					af2.type = gsn_bleeding;
					af2.level = ch->level;
					af2.location = APPLY_NONE;
					af2.modifier = 0;
					af2.aftype = AFT_INVIS;
					af2.tick_fun = bleeding_tick;
					af2.end_fun = nullptr;
					af2.owner = ch;
					new_affect_to_char(victim, &af2);
					break;
				case WEAPON_FLAIL:
					act("You hear the chilling sound of snapping bone as you land a solid blow.", ch, 0, victim, TO_CHAR);
					act("You hear the chilling sound of snapping bone as $n lands a solid blow.", ch, 0, victim, TO_ROOM);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 6);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move / 2, 0);
					break;
				case WEAPON_STAFF:
					act("You hear the chilling sound of snapping bone as you land a solid blow.", ch, 0, victim, TO_CHAR);
					act("You hear the chilling sound of snapping bone as $n lands a solid blow.", ch, 0, victim, TO_ROOM);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 6);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move / 2, 0);
					break;
				case WEAPON_SPEAR:
					act("$N falters, clutching $S leg in agony as your spear pierces $M clean through!", ch, 0, victim, TO_CHAR);
					act("You falter, clutching your leg in agony as $n's spear pierces you clean through!", ch, 0, victim, TO_VICT);
					act("$N falters, clutching $S leg in agony as $n's spear pierces $M clean through!", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 7);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move - ch->level / 2, 0);
					LAG_CHAR(victim, PULSE_VIOLENCE * 2);
					break;
				case WEAPON_DAGGER:
					act("$N collapses to the ground in agony as you sever a tendon!", ch, 0, victim, TO_CHAR);
					act("You collapse to the ground in agony as $n severs a tendon!", ch, 0, victim, TO_VICT);
					act("$N collapses to the ground in agony as $n severs a tendon!", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 5);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					LAG_CHAR(victim, PULSE_VIOLENCE * 2);
					break;
			}

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = ch->level / 8;
			af.type = gsn_hobble;
			af.level = ch->level;
			af.location = APPLY_LEGS;
			af.modifier = -1;
			af.aftype = AFT_INVIS;
			affect_to_char(victim, &af);

			one_hit_new(ch, victim, gsn_hobble, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 120, nullptr);
		}
		else
		{
			one_hit_new(ch, victim, gsn_hobble, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 80, nullptr);

			if (!is_affected(victim, gsn_hobble))
			{
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.duration = ch->level / 8;
				af.type = gsn_hobble;
				af.level = ch->level;
				af.location = APPLY_DEX;

				switch (weapon->value[0])
				{
					case WEAPON_MACE:
						af.modifier = -(ch->level / 10);
						break;
					case WEAPON_AXE:
						af.modifier = -(ch->level / 12);
						break;
					case WEAPON_SWORD:
						af.modifier = -(ch->level / 12);
						break;
					case WEAPON_FLAIL:
						af.modifier = -(ch->level / 10);
						break;
					case WEAPON_STAFF:
						af.modifier = -(ch->level / 10);
						break;
					case WEAPON_SPEAR:
						af.modifier = -(ch->level / 12);
						break;
					case WEAPON_DAGGER:
						af.modifier = -(ch->level / 8);
						break;
				}

				af.aftype = AFT_MALADY;
				affect_to_char(victim, &af);
			}
		}

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		check_improve(ch, gsn_hobble, true, 1);
	}
	else
	{
		damage(ch, victim, 0, gsn_hobble, DAM_NONE, true);
		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		check_improve(ch, gsn_hobble, false, 1);
	}
}